

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

void linux_kqueue_free(kqueue *kq)

{
  ssize_t sVar1;
  int *piVar2;
  long in_RDI;
  int pipefd;
  ssize_t ret;
  char buffer;
  undefined1 local_9;
  long local_8;
  
  local_8 = in_RDI;
  if (0 < *(int *)(in_RDI + 0x7c0)) {
    close(*(int *)(in_RDI + 0x7c0));
    *(undefined4 *)(local_8 + 0x7c0) = 0xffffffff;
  }
  sVar1 = read(*(int *)(local_8 + 0x7c4),&local_9,1);
  if ((sVar1 == -1) && (piVar2 = __errno_location(), *piVar2 == 0xb)) {
    close(*(int *)(local_8 + 0x7c8));
    *(undefined4 *)(local_8 + 0x7c8) = 0xffffffff;
  }
  if (0 < *(int *)(local_8 + 0x7c4)) {
    close(*(int *)(local_8 + 0x7c4));
    *(undefined4 *)(local_8 + 0x7c4) = 0xffffffff;
  }
  return;
}

Assistant:

static void
linux_kqueue_free(struct kqueue *kq)
{
    char buffer;
    ssize_t ret;
    int pipefd;

    if (kq->epollfd > 0) {
        dbg_printf("epoll_fd=%i - closed", kq->epollfd);

        if (close(kq->epollfd) < 0)
            dbg_perror("close(2) - epoll_fd=%i", kq->epollfd);
        kq->epollfd = -1;
    }

    /*
     * read will return 0 on pipe EOF (i.e. if the write end of the pipe has been closed)
     *
     * kq->pipefd[1] should have already been called outside of libkqueue
     * as a signal the kqueue should be closed.
     */
    ret = read(kq->pipefd[0], &buffer, 1);
    if (ret == -1 && errno == EWOULDBLOCK) {
        // Shoudn't happen unless kqops.kqueue_free is called on an open FD
        dbg_puts("kqueue wasn't closed");

        if (close(kq->pipefd[1]) < 0) {
            dbg_perror("close(2) - pipefd[1]=%i", kq->pipefd[1]);
        } else {
            dbg_printf("pipefd[1]=%i - closed", kq->pipefd[1]);
        }
        kq->pipefd[1] = -1;
    } else if (ret > 0) {
        // Shouldn't happen unless data is written to kqueue FD
        // Ignore write and continue with close
        dbg_puts("unexpected data available on kqueue FD");
        assert(0);
    }

    pipefd = kq->pipefd[0];
    if (pipefd > 0) {
        if (close(pipefd) < 0) {
            dbg_perror("close(2) - kq_fd=%i", kq->pipefd[0]);
        } else {
            dbg_printf("kq_fd=%i - closed", kq->pipefd[0]);
        }
        kq->pipefd[0] = -1;
    }
}